

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz-test.cpp
# Opt level: O1

void __thiscall test_encode_decode_low_power::test_method(test_encode_decode_low_power *this)

{
  byte bVar1;
  byte *pbVar2;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  undefined8 extraout_RDX_00;
  encoder<signed_char> *this_00;
  ulong uVar4;
  pointer ppVar5;
  initializer_list<unsigned_char> __l;
  complex<double> iq;
  bool called;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
  complex_bytes1;
  encoder<signed_char> waver;
  demod_nrz zwave;
  undefined1 local_5b9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_5b8;
  vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
  local_5a0;
  _Any_data local_588;
  code *local_578;
  code *pcStack_570;
  undefined1 local_560;
  undefined8 local_558;
  shared_count sStack_550;
  char *local_548;
  char *local_540;
  char *local_538;
  char *local_530;
  undefined1 *local_528;
  undefined1 *local_520;
  char *local_518;
  char *local_510;
  encoder<signed_char> local_508;
  undefined **local_350;
  undefined1 local_348;
  undefined8 *local_340;
  char **local_338;
  demod_nrz local_330;
  
  local_330.fsk_demod.s1._M_value._0_8_ = 0xff0d55aa2233d6d2;
  local_330.fsk_demod.s1._M_value._8_4_ = 0x9f00ff00;
  __l._M_len = 0xc;
  __l._M_array = (iterator)&local_330;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_5b8,__l,(allocator_type *)&local_508);
  bVar1 = 0xff;
  for (pbVar2 = local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      pbVar2 != local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
    bVar1 = bVar1 ^ *pbVar2;
  }
  local_330.fsk_demod.s1._M_value[0] = bVar1;
  if (local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (&local_5b8,
               (iterator)
               local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,(uchar *)&local_330);
  }
  else {
    *local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_finish = bVar1;
    local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_588._M_unused._M_object = &local_5b9;
  local_5b9 = 0;
  pcStack_570 = std::
                _Function_handler<void_(unsigned_char_*,_unsigned_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp:100:26)>
                ::_M_invoke;
  local_578 = std::
              _Function_handler<void_(unsigned_char_*,_unsigned_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp:100:26)>
              ::_M_manager;
  local_588._8_8_ = &local_5b8;
  wavingz::demod::demod_nrz::demod_nrz
            (&local_330,0x1f4000,(function<void_(unsigned_char_*,_unsigned_char_*)> *)&local_588);
  if (local_578 != (code *)0x0) {
    (*local_578)(&local_588,&local_588,__destroy_functor);
  }
  wavingz::encoder<signed_char>::encoder(&local_508,2000000,40000,5.0);
  this_00 = &local_508;
  wavingz::encoder<signed_char>::operator()
            (&local_5a0,this_00,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,0.1);
  if (local_5a0.
      super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_5a0.
      super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar3 = extraout_RDX;
    ppVar5 = local_5a0.
             super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      iq._M_value._8_8_ = uVar3;
      iq._M_value._0_8_ = this_00;
      wavingz::demod::demod_nrz::operator()(&local_330,iq);
      ppVar5 = ppVar5 + 1;
      uVar3 = extraout_RDX_00;
    } while (ppVar5 != local_5a0.
                       super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_518 = 
  "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp";
  local_510 = "";
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_518,0x72);
  local_560 = local_5b9;
  local_558 = 0;
  sStack_550.pi_ = (sp_counted_base *)0x0;
  local_338 = &local_538;
  local_538 = "called";
  local_530 = "";
  local_348 = 0;
  local_350 = &PTR__lazy_ostream_00113bb8;
  local_340 = &boost::unit_test::lazy_ostream::inst;
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp";
  local_540 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_550);
  if (local_5a0.
      super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5a0.
                    super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  uVar4 = 0;
  if ((long)local_508.lp2.yv_m.m_end - (long)local_508.lp2.yv_m.m_first >> 3 <=
      (long)local_508.lp2.yv_m.m_size) {
    uVar4 = (ulong)((long)local_508.lp2.yv_m.m_end - (long)local_508.lp2.yv_m.m_buff) >> 3;
  }
  local_508.lp2.yv_m.m_first = local_508.lp2.yv_m.m_first + (local_508.lp2.yv_m.m_size - uVar4);
  if (local_508.lp2.yv_m.m_buff != (pointer)0x0) {
    operator_delete(local_508.lp2.yv_m.m_buff);
  }
  uVar4 = 0;
  if ((long)local_508.lp2.xv_m.m_end - (long)local_508.lp2.xv_m.m_first >> 3 <=
      (long)local_508.lp2.xv_m.m_size) {
    uVar4 = (ulong)((long)local_508.lp2.xv_m.m_end - (long)local_508.lp2.xv_m.m_buff) >> 3;
  }
  local_508.lp2.xv_m.m_first = local_508.lp2.xv_m.m_first + (local_508.lp2.xv_m.m_size - uVar4);
  if (local_508.lp2.xv_m.m_buff != (pointer)0x0) {
    operator_delete(local_508.lp2.xv_m.m_buff);
  }
  uVar4 = 0;
  if ((long)local_508.lp1.yv_m.m_end - (long)local_508.lp1.yv_m.m_first >> 3 <=
      (long)local_508.lp1.yv_m.m_size) {
    uVar4 = (ulong)((long)local_508.lp1.yv_m.m_end - (long)local_508.lp1.yv_m.m_buff) >> 3;
  }
  local_508.lp1.yv_m.m_first = local_508.lp1.yv_m.m_first + (local_508.lp1.yv_m.m_size - uVar4);
  if (local_508.lp1.yv_m.m_buff != (pointer)0x0) {
    operator_delete(local_508.lp1.yv_m.m_buff);
  }
  uVar4 = 0;
  if ((long)local_508.lp1.xv_m.m_end - (long)local_508.lp1.xv_m.m_first >> 3 <=
      (long)local_508.lp1.xv_m.m_size) {
    uVar4 = (ulong)((long)local_508.lp1.xv_m.m_end - (long)local_508.lp1.xv_m.m_buff) >> 3;
  }
  local_508.lp1.xv_m.m_first = local_508.lp1.xv_m.m_first + (local_508.lp1.xv_m.m_size - uVar4);
  if (local_508.lp1.xv_m.m_buff != (pointer)0x0) {
    operator_delete(local_508.lp1.xv_m.m_buff);
  }
  wavingz::demod::demod_nrz::~demod_nrz(&local_330);
  if (local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_encode_decode_low_power)
{

    std::vector<uint8_t> buffer = { 0xd2, 0xd6, 0x33, 0x22, 0xAA, 0x55, 13, 0xFF, 0x00, 0xFF, 0x00, 0x9f };
    buffer.push_back(wavingz::checksum(buffer.begin(), buffer.end()));

    bool called = false;
    auto wave_callback = [&](uint8_t* begin, uint8_t* end)
    {
        called = true;
        BOOST_CHECK(end-begin >= 13); // we may have some more noisy bytes in the end
        BOOST_CHECK_EQUAL_COLLECTIONS(begin, begin+begin[6], buffer.begin(), buffer.end());
    };

    wavingz::demod::demod_nrz zwave(2048000, wave_callback);
    wavingz::encoder<int8_t> waver(2000000, 40000, 5);
    auto complex_bytes1 = waver(buffer.begin(), buffer.end(), 0.1);
    for(auto pair: complex_bytes1)
    {
        zwave(std::complex<double>(double(pair.first)/127.0, double(pair.second)/127.0));
    }
    BOOST_CHECK(called);
}